

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__WildcardPattern_00280ca0;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

WildcardPattern::~WildcardPattern() {}